

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
::find_or_prepare_insert_non_soo<google::protobuf::Descriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
          *this,Descriptor **key)

{
  ulong uVar1;
  uint uVar2;
  ushort uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  undefined1 uVar20;
  bool bVar21;
  ushort uVar22;
  ctrl_t *pcVar23;
  slot_type *psVar24;
  ctrl_t *pcVar25;
  size_t sVar26;
  anon_union_8_1_a8a14541_for_iterator_2 aVar27;
  PolicyFunctions *in_R9;
  ulong uVar28;
  CommonFields *common;
  size_t cap;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  iterator iVar39;
  FindInfo target;
  __m128i match;
  ctrl_t cVar32;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  
  if (*(long *)this == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>, K = const google::protobuf::Descriptor *]"
                 );
  }
  if (*(long *)this == 0) {
LAB_0100104e:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
              *)this);
  uVar1 = *(ulong *)this;
  if ((uVar1 + 1 & uVar1) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar28 = ((ulong)*key ^ 0x1976508) * -0x234dd359734ecb13;
  uVar28 = ((uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
             (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
             (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 |
            uVar28 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 | (uVar28 & 0xff0000000000) >> 0x18
            | (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
            (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
  uVar31 = ((ulong)common >> 7 ^ *(ulong *)(this + 0x10) >> 0xc) & uVar1;
  pcVar23 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
            ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                       *)this);
  uVar20 = (undefined1)(uVar28 >> 0x38);
  auVar33 = ZEXT216(CONCAT11(uVar20,uVar20) & 0x7f7f);
  auVar33 = pshuflw(auVar33,auVar33,0);
  iVar39 = __return_storage_ptr__->first;
  bVar21 = __return_storage_ptr__->second;
  uVar28 = 0;
  do {
    pcVar25 = pcVar23 + uVar31;
    cVar4 = *pcVar25;
    cVar5 = pcVar25[1];
    cVar6 = pcVar25[2];
    cVar7 = pcVar25[3];
    cVar8 = pcVar25[4];
    cVar9 = pcVar25[5];
    cVar10 = pcVar25[6];
    cVar11 = pcVar25[7];
    cVar12 = pcVar25[8];
    cVar13 = pcVar25[9];
    cVar14 = pcVar25[10];
    cVar15 = pcVar25[0xb];
    cVar16 = pcVar25[0xc];
    cVar17 = pcVar25[0xd];
    cVar18 = pcVar25[0xe];
    cVar19 = pcVar25[0xf];
    cVar32 = auVar33[0];
    auVar34[0] = -(cVar32 == cVar4);
    cVar35 = auVar33[1];
    auVar34[1] = -(cVar35 == cVar5);
    cVar36 = auVar33[2];
    auVar34[2] = -(cVar36 == cVar6);
    cVar37 = auVar33[3];
    auVar34[3] = -(cVar37 == cVar7);
    auVar34[4] = -(cVar32 == cVar8);
    auVar34[5] = -(cVar35 == cVar9);
    auVar34[6] = -(cVar36 == cVar10);
    auVar34[7] = -(cVar37 == cVar11);
    auVar34[8] = -(cVar32 == cVar12);
    auVar34[9] = -(cVar35 == cVar13);
    auVar34[10] = -(cVar36 == cVar14);
    auVar34[0xb] = -(cVar37 == cVar15);
    auVar34[0xc] = -(cVar32 == cVar16);
    auVar34[0xd] = -(cVar35 == cVar17);
    auVar34[0xe] = -(cVar36 == cVar18);
    auVar34[0xf] = -(cVar37 == cVar19);
    uVar22 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
    uVar30 = (uint)uVar22;
    pcVar25 = iVar39.ctrl_;
    aVar27 = iVar39.field_1;
    while (uVar22 != 0) {
      uVar2 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      psVar24 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                              *)this);
      uVar29 = uVar2 + uVar31 & uVar1;
      if (psVar24[uVar29].value.first == *key) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar21;
        (__return_storage_ptr__->first).ctrl_ = pcVar25;
        iVar39 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                                *)this,uVar29);
        __return_storage_ptr__->first = iVar39;
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      uVar22 = (ushort)(uVar30 - 1) & (ushort)uVar30;
      uVar30 = CONCAT22((short)(uVar30 - 1 >> 0x10),uVar22);
    }
    auVar38[0] = -(cVar4 == kEmpty);
    auVar38[1] = -(cVar5 == kEmpty);
    auVar38[2] = -(cVar6 == kEmpty);
    auVar38[3] = -(cVar7 == kEmpty);
    auVar38[4] = -(cVar8 == kEmpty);
    auVar38[5] = -(cVar9 == kEmpty);
    auVar38[6] = -(cVar10 == kEmpty);
    auVar38[7] = -(cVar11 == kEmpty);
    auVar38[8] = -(cVar12 == kEmpty);
    auVar38[9] = -(cVar13 == kEmpty);
    auVar38[10] = -(cVar14 == kEmpty);
    auVar38[0xb] = -(cVar15 == kEmpty);
    auVar38[0xc] = -(cVar16 == kEmpty);
    auVar38[0xd] = -(cVar17 == kEmpty);
    auVar38[0xe] = -(cVar18 == kEmpty);
    auVar38[0xf] = -(cVar19 == kEmpty);
    uVar22 = (ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe | (ushort)(auVar38[0xf] >> 7) << 0xf;
    sVar26 = *(size_t *)this;
    if (uVar22 == 0) {
      if (sVar26 == 0) goto LAB_0100103e;
      uVar29 = uVar28 + 0x10;
      if (sVar26 < uVar29) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar21;
        (__return_storage_ptr__->first).ctrl_ = pcVar25;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>, K = const google::protobuf::Descriptor *]"
                     );
      }
      uVar31 = uVar31 + uVar28 + 0x10 & uVar1;
    }
    else {
      if (sVar26 == 0) {
LAB_0100103e:
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar21;
        (__return_storage_ptr__->first).ctrl_ = pcVar25;
        goto LAB_0100104e;
      }
      pcVar25 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                           *)this);
      bVar21 = ShouldInsertBackwardsForDebug(sVar26,(size_t)common,pcVar25);
      if (bVar21) {
        uVar3 = 0xf;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar30 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar30 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = uVar28;
      sVar26 = PrepareInsertNonSoo((container_internal *)this,common,uVar30 + uVar31 & uVar1,target,
                                   in_R9);
      iVar39 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                              *)this,sVar26);
      bVar21 = true;
      uVar29 = uVar28;
    }
    uVar28 = uVar29;
    if (uVar22 != 0) {
      (__return_storage_ptr__->first).field_1 = iVar39.field_1;
      __return_storage_ptr__->second = bVar21;
      (__return_storage_ptr__->first).ctrl_ = iVar39.ctrl_;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }